

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkTestTools.cpp
# Opt level: O0

void __thiscall test::FunctionTimer::Print(FunctionTimer *this,uint trials)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  int in_ESI;
  long in_RDI;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 in_ZMM0 [64];
  undefined1 in_ZMM1 [64];
  LogStringBuffer buffer;
  LogStringBuffer buffer_1;
  char *in_stack_fffffffffffff1e8;
  LogStringBuffer *in_stack_fffffffffffff1f0;
  LogStringBuffer *in_stack_fffffffffffff228;
  LogStringBuffer *buffer_00;
  OutputWorker *in_stack_fffffffffffff230;
  LogStringBuffer *pLVar6;
  LogStringBuffer *this_00;
  float local_d4c;
  double local_d48;
  float local_d3c;
  double local_d38;
  uint local_d2c [3];
  char *local_d20;
  ulong *local_d18;
  char *local_d10;
  double *local_d08;
  char *local_d00;
  ulong *local_cf8;
  char *local_cf0;
  string *local_ce8;
  undefined8 *local_ce0;
  char *local_cd8;
  uint *local_cd0;
  char *local_cc8;
  float *local_cc0;
  char *local_cb8;
  double *local_cb0;
  char *local_ca8;
  float *local_ca0;
  char *local_c98;
  string *local_c90;
  undefined8 *local_c88;
  char *local_c80;
  ulong *local_c78;
  char *local_c70;
  double *local_c68;
  char *local_c60;
  ulong *local_c58;
  char *local_c50;
  string *local_c48;
  undefined4 local_c3c;
  undefined8 *local_c38;
  undefined4 local_c2c;
  undefined8 *local_c28;
  undefined1 local_c10 [16];
  ostream aoStack_c00 [376];
  char *local_a88;
  ulong *local_a80;
  char *local_a78;
  double *local_a70;
  char *local_a68;
  ulong *local_a60;
  char *local_a58;
  string *local_a50;
  undefined4 local_a44;
  undefined8 *local_a40;
  char *local_a38;
  ulong *local_a30;
  char *local_a28;
  double *local_a20;
  char *local_a18;
  ulong *local_a10;
  char *local_a08;
  string *local_a00;
  undefined *local_9f8;
  undefined1 *local_9f0;
  undefined8 *local_9e8;
  undefined *local_9e0;
  undefined1 *local_9d8;
  undefined8 *local_9d0;
  char *local_9c8;
  ulong *local_9c0;
  char *local_9b8;
  double *local_9b0;
  char *local_9a8;
  ulong *local_9a0;
  char *local_998;
  string *local_990;
  undefined1 *local_988;
  undefined8 *local_980;
  undefined *local_978;
  undefined1 *local_970;
  string *local_968;
  undefined1 *local_960;
  undefined8 *local_958;
  string *local_950;
  undefined1 *local_948;
  char *local_940;
  ulong *local_938;
  char *local_930;
  double *local_928;
  char *local_920;
  ulong *local_918;
  char *local_910;
  undefined1 *local_908;
  undefined8 *local_900;
  char *local_8f8;
  undefined1 *local_8f0;
  undefined8 *local_8e8;
  char *local_8e0;
  ulong *local_8d8;
  char *local_8d0;
  double *local_8c8;
  char *local_8c0;
  ulong *local_8b8;
  undefined1 *local_8b0;
  undefined8 *local_8a8;
  char *local_8a0;
  undefined1 *local_898;
  ulong *local_890;
  undefined1 *local_888;
  undefined8 *local_880;
  char *local_878;
  ulong *local_870;
  char *local_868;
  double *local_860;
  char *local_858;
  undefined1 *local_850;
  undefined8 *local_848;
  ulong *local_840;
  undefined1 *local_838;
  char *local_830;
  undefined1 *local_828;
  undefined8 *local_820;
  char *local_818;
  ulong *local_810;
  char *local_808;
  double *local_800;
  undefined1 *local_7f8;
  undefined8 *local_7f0;
  char *local_7e8;
  undefined1 *local_7e0;
  double *local_7d8;
  undefined1 *local_7d0;
  undefined8 *local_7c8;
  char *local_7c0;
  ulong *local_7b8;
  char *local_7b0;
  undefined1 *local_7a8;
  undefined8 *local_7a0;
  double *local_798;
  undefined1 *local_790;
  char *local_788;
  undefined1 *local_780;
  undefined8 *local_778;
  char *local_770;
  ulong *local_768;
  undefined1 *local_760;
  undefined8 *local_758;
  ulong *local_750;
  undefined1 *local_748;
  undefined8 *local_740;
  ulong *local_738;
  undefined1 *local_730;
  char *local_728;
  undefined1 *local_720;
  char *local_718;
  undefined1 *local_710;
  undefined8 *local_708;
  char *local_700;
  undefined1 *local_6f8;
  char *local_6f0;
  uint *local_6e8;
  char *local_6e0;
  float *local_6d8;
  char *local_6d0;
  double *local_6c8;
  char *local_6c0;
  float *local_6b8;
  char *local_6b0;
  string *local_6a8;
  undefined4 local_69c;
  undefined8 *local_698;
  undefined4 local_68c;
  undefined8 *local_688;
  undefined1 local_670 [16];
  ostream aoStack_660 [376];
  char *local_4e8;
  uint *local_4e0;
  char *local_4d8;
  float *local_4d0;
  char *local_4c8;
  double *local_4c0;
  char *local_4b8;
  float *local_4b0;
  char *local_4a8;
  string *local_4a0;
  undefined4 local_494;
  undefined8 *local_490;
  char *local_488;
  uint *local_480;
  char *local_478;
  float *local_470;
  char *local_468;
  double *local_460;
  char *local_458;
  float *local_450;
  char *local_448;
  string *local_440;
  undefined *local_438;
  undefined1 *local_430;
  undefined8 *local_428;
  undefined *local_420;
  undefined1 *local_418;
  undefined8 *local_410;
  undefined *local_408;
  undefined1 *local_400;
  char *local_3f8;
  uint *local_3f0;
  char *local_3e8;
  float *local_3e0;
  char *local_3d8;
  double *local_3d0;
  char *local_3c8;
  float *local_3c0;
  char *local_3b8;
  string *local_3b0;
  undefined1 *local_3a8;
  undefined8 *local_3a0;
  string *local_398;
  undefined1 *local_390;
  undefined8 *local_388;
  string *local_380;
  undefined1 *local_378;
  char *local_370;
  uint *local_368;
  char *local_360;
  float *local_358;
  char *local_350;
  double *local_348;
  char *local_340;
  float *local_338;
  char *local_330;
  undefined1 *local_328;
  undefined8 *local_320;
  char *local_318;
  undefined1 *local_310;
  undefined8 *local_308;
  char *local_300;
  undefined1 *local_2f8;
  char *local_2f0;
  uint *local_2e8;
  char *local_2e0;
  float *local_2d8;
  char *local_2d0;
  double *local_2c8;
  char *local_2c0;
  float *local_2b8;
  undefined1 *local_2b0;
  LogStringBuffer *local_2a8;
  float *local_2a0;
  undefined1 *local_298;
  LogStringBuffer *local_290;
  char *local_288;
  uint *local_280;
  char *local_278;
  float *local_270;
  char *local_268;
  double *local_260;
  char *local_258;
  undefined1 *local_250;
  LogStringBuffer *local_248;
  float *local_240;
  undefined1 *local_238;
  char *local_230;
  undefined1 *local_228;
  LogStringBuffer *local_220;
  char *local_218;
  uint *local_210;
  char *local_208;
  float *local_200;
  char *local_1f8;
  double *local_1f0;
  undefined1 *local_1e8;
  LogStringBuffer *local_1e0;
  double *local_1d8;
  undefined1 *local_1d0;
  LogStringBuffer *local_1c8;
  double *local_1c0;
  undefined1 *local_1b8;
  char *local_1b0;
  undefined1 *local_1a8;
  char *local_1a0;
  uint *local_198;
  char *local_190;
  float *local_188;
  char *local_180;
  undefined1 *local_178;
  LogStringBuffer *local_170;
  char *local_168;
  undefined1 *local_160;
  LogStringBuffer *local_158;
  char *local_150;
  undefined1 *local_148;
  char *local_140;
  uint *local_138;
  char *local_130;
  float *local_128;
  undefined1 *local_120;
  LogStringBuffer *local_118;
  float *local_110;
  undefined1 *local_108;
  LogStringBuffer *local_100;
  float *local_f8;
  undefined1 *local_f0;
  char *local_e8;
  uint *local_e0;
  char *local_d8;
  undefined1 *local_d0;
  LogStringBuffer *local_c8;
  char *local_c0;
  undefined1 *local_b8;
  LogStringBuffer *local_b0;
  char *local_a8;
  uint *local_a0;
  undefined1 *local_98;
  LogStringBuffer *local_90;
  char *local_88;
  undefined1 *local_80;
  uint *local_78;
  undefined1 *local_70;
  LogStringBuffer *local_68;
  char *local_60;
  undefined1 *local_58;
  LogStringBuffer *local_50;
  uint *local_48;
  undefined1 *local_40;
  char *local_38;
  undefined1 *local_30;
  
  if (in_ESI == 1) {
    local_ce8 = (string *)(in_RDI + 0x40);
    local_cf8 = (ulong *)(in_RDI + 0x30);
    auVar1 = vcvtusi2sd_avx512f(in_ZMM0._0_16_,*(undefined8 *)(in_RDI + 0x38));
    auVar2 = vcvtusi2sd_avx512f(in_ZMM1._0_16_,*(undefined8 *)(in_RDI + 0x30));
    local_d38 = auVar1._0_8_ / auVar2._0_8_;
    local_d18 = (ulong *)(in_RDI + 0x38);
    local_ce0 = &Logger;
    local_cf0 = " called ";
    local_d00 = " times.  ";
    local_d08 = &local_d38;
    local_d10 = " usec avg for all invokations.  ";
    local_d20 = " usec";
    local_c38 = &Logger;
    local_c3c = 2;
    local_c50 = " called ";
    local_c60 = " times.  ";
    local_c70 = " usec avg for all invokations.  ";
    local_c80 = " usec";
    local_c28 = &Logger;
    local_c2c = 2;
    if (DAT_00129388 < 3) {
      local_a40 = &Logger;
      local_a44 = 2;
      local_a58 = " called ";
      local_a68 = " times.  ";
      local_a78 = " usec avg for all invokations.  ";
      local_a88 = " usec";
      local_c78 = local_d18;
      local_c68 = local_d08;
      local_c58 = local_cf8;
      local_c48 = local_ce8;
      local_a80 = local_d18;
      local_a70 = local_d08;
      local_a60 = local_cf8;
      local_a50 = local_ce8;
      logger::LogStringBuffer::LogStringBuffer
                (in_stack_fffffffffffff1f0,in_stack_fffffffffffff1e8,Trace);
      local_9f8 = &DAT_001293b8;
      local_9e8 = &Logger;
      local_a00 = local_a50;
      local_a08 = local_a58;
      local_a10 = local_a60;
      local_a18 = local_a68;
      local_a20 = local_a70;
      local_a28 = local_a78;
      local_a30 = local_a80;
      local_a38 = local_a88;
      local_9d0 = &Logger;
      local_9f0 = local_c10;
      local_9e0 = local_9f8;
      local_9d8 = local_c10;
      local_978 = local_9f8;
      local_970 = local_c10;
      std::operator<<(aoStack_c00,(string *)&DAT_001293b8);
      local_980 = &Logger;
      local_988 = local_9f0;
      local_990 = local_a00;
      local_998 = local_a08;
      local_9a0 = local_a10;
      local_9a8 = local_a18;
      local_9b0 = local_a20;
      local_9b8 = local_a28;
      local_9c0 = local_a30;
      local_9c8 = local_a38;
      local_958 = &Logger;
      local_960 = local_9f0;
      local_968 = local_a00;
      local_948 = local_9f0;
      local_950 = local_a00;
      std::operator<<((ostream *)(local_9f0 + 0x10),local_a00);
      local_900 = &Logger;
      local_908 = local_988;
      local_910 = local_998;
      local_918 = local_9a0;
      local_920 = local_9a8;
      local_928 = local_9b0;
      local_930 = local_9b8;
      local_938 = local_9c0;
      local_940 = local_9c8;
      local_8e8 = &Logger;
      local_8f0 = local_988;
      local_8f8 = local_998;
      local_898 = local_988;
      local_8a0 = local_998;
      std::operator<<((ostream *)(local_988 + 0x10),local_998);
      local_8a8 = &Logger;
      local_8b0 = local_908;
      local_8b8 = local_918;
      local_8c0 = local_920;
      local_8c8 = local_928;
      local_8d0 = local_930;
      local_8d8 = local_938;
      local_8e0 = local_940;
      local_880 = &Logger;
      local_888 = local_908;
      local_890 = local_918;
      local_838 = local_908;
      local_840 = local_918;
      std::ostream::operator<<((ostream *)(local_908 + 0x10),*local_918);
      local_848 = &Logger;
      local_850 = local_8b0;
      local_858 = local_8c0;
      local_860 = local_8c8;
      local_868 = local_8d0;
      local_870 = local_8d8;
      local_878 = local_8e0;
      local_820 = &Logger;
      local_828 = local_8b0;
      local_830 = local_8c0;
      local_7e0 = local_8b0;
      local_7e8 = local_8c0;
      std::operator<<((ostream *)(local_8b0 + 0x10),local_8c0);
      local_7f0 = &Logger;
      local_7f8 = local_850;
      local_800 = local_860;
      local_808 = local_868;
      local_810 = local_870;
      local_818 = local_878;
      local_7c8 = &Logger;
      local_7d0 = local_850;
      local_7d8 = local_860;
      local_790 = local_850;
      local_798 = local_860;
      std::ostream::operator<<((ostream *)(local_850 + 0x10),*local_860);
      local_7a0 = &Logger;
      local_7a8 = local_7f8;
      local_7b0 = local_808;
      local_7b8 = local_810;
      local_7c0 = local_818;
      local_778 = &Logger;
      local_780 = local_7f8;
      local_788 = local_808;
      local_720 = local_7f8;
      local_728 = local_808;
      std::operator<<((ostream *)(local_7f8 + 0x10),local_808);
      local_758 = &Logger;
      local_760 = local_7a8;
      local_768 = local_7b8;
      local_770 = local_7c0;
      local_740 = &Logger;
      local_748 = local_7a8;
      local_750 = local_7b8;
      local_730 = local_7a8;
      local_738 = local_7b8;
      std::ostream::operator<<((ostream *)(local_7a8 + 0x10),*local_7b8);
      local_708 = &Logger;
      local_710 = local_760;
      local_718 = local_770;
      local_6f8 = local_760;
      local_700 = local_770;
      std::operator<<((ostream *)(local_760 + 0x10),local_770);
      logger::OutputWorker::GetInstance();
      logger::OutputWorker::Write(in_stack_fffffffffffff230,in_stack_fffffffffffff228);
      logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x110fd3);
    }
  }
  else {
    local_c90 = (string *)(in_RDI + 0x40);
    auVar1 = vcvtusi2ss_avx512f(in_ZMM0._0_16_,*(undefined8 *)(in_RDI + 0x30));
    auVar2 = vcvtusi2ss_avx512f(in_ZMM1._0_16_,in_ESI);
    auVar4._0_4_ = auVar1._0_4_ / auVar2._0_4_;
    auVar4._4_12_ = auVar1._4_12_;
    auVar1 = vcvtusi2sd_avx512f(auVar4,*(undefined8 *)(in_RDI + 0x38));
    auVar2 = vcvtusi2sd_avx512f(auVar2,*(undefined8 *)(in_RDI + 0x30));
    auVar5._0_8_ = auVar1._0_8_ / auVar2._0_8_;
    auVar5._8_8_ = auVar1._8_8_;
    auVar3 = vcvtusi2ss_avx512f(auVar5,*(undefined8 *)(in_RDI + 0x38));
    auVar1 = vcvtusi2ss_avx512f(auVar2,in_ESI);
    local_d4c = auVar3._0_4_ / auVar1._0_4_;
    local_c88 = &Logger;
    local_c98 = " called ";
    local_ca0 = &local_d3c;
    local_ca8 = " times per trial (avg).  ";
    local_cb0 = &local_d48;
    local_cb8 = " usec avg for all invokations.  ";
    local_cc0 = &local_d4c;
    local_cc8 = " usec (avg) of ";
    local_cd0 = local_d2c;
    local_cd8 = " trials";
    local_698 = &Logger;
    local_69c = 2;
    local_6b0 = " called ";
    local_6c0 = " times per trial (avg).  ";
    local_6d0 = " usec avg for all invokations.  ";
    local_6e0 = " usec (avg) of ";
    local_6f0 = " trials";
    local_688 = &Logger;
    local_68c = 2;
    if (DAT_00129388 < 3) {
      local_490 = &Logger;
      local_494 = 2;
      local_4a8 = " called ";
      local_4b8 = " times per trial (avg).  ";
      local_4c8 = " usec avg for all invokations.  ";
      local_4d8 = " usec (avg) of ";
      local_4e8 = " trials";
      local_d48 = auVar5._0_8_;
      local_d3c = auVar4._0_4_;
      local_6e8 = local_cd0;
      local_6d8 = local_cc0;
      local_6c8 = local_cb0;
      local_6b8 = local_ca0;
      local_6a8 = local_c90;
      local_4e0 = local_cd0;
      local_4d0 = local_cc0;
      local_4c0 = local_cb0;
      local_4b0 = local_ca0;
      local_4a0 = local_c90;
      logger::LogStringBuffer::LogStringBuffer
                (in_stack_fffffffffffff1f0,in_stack_fffffffffffff1e8,Trace);
      local_438 = &DAT_001293b8;
      local_428 = &Logger;
      local_440 = local_4a0;
      local_448 = local_4a8;
      local_450 = local_4b0;
      local_458 = local_4b8;
      local_460 = local_4c0;
      local_468 = local_4c8;
      local_470 = local_4d0;
      local_478 = local_4d8;
      local_480 = local_4e0;
      local_488 = local_4e8;
      local_410 = &Logger;
      local_430 = local_670;
      local_420 = local_438;
      local_418 = local_670;
      local_408 = local_438;
      local_400 = local_670;
      std::operator<<(aoStack_660,(string *)&DAT_001293b8);
      local_3a0 = &Logger;
      local_3a8 = local_430;
      local_3b0 = local_440;
      local_3b8 = local_448;
      local_3c0 = local_450;
      local_3c8 = local_458;
      local_3d0 = local_460;
      local_3d8 = local_468;
      local_3e0 = local_470;
      local_3e8 = local_478;
      local_3f0 = local_480;
      local_3f8 = local_488;
      local_388 = &Logger;
      local_390 = local_430;
      local_398 = local_440;
      local_378 = local_430;
      local_380 = local_440;
      std::operator<<((ostream *)(local_430 + 0x10),local_440);
      local_320 = &Logger;
      local_328 = local_3a8;
      local_330 = local_3b8;
      local_338 = local_3c0;
      local_340 = local_3c8;
      local_348 = local_3d0;
      local_350 = local_3d8;
      local_358 = local_3e0;
      local_360 = local_3e8;
      local_368 = local_3f0;
      local_370 = local_3f8;
      pLVar6 = (LogStringBuffer *)&Logger;
      local_308 = &Logger;
      local_310 = local_3a8;
      local_318 = local_3b8;
      local_2f8 = local_3a8;
      local_300 = local_3b8;
      std::operator<<((ostream *)(local_3a8 + 0x10),local_3b8);
      local_2b0 = local_328;
      local_2b8 = local_338;
      local_2c0 = local_340;
      local_2c8 = local_348;
      local_2d0 = local_350;
      local_2d8 = local_358;
      local_2e0 = local_360;
      local_2e8 = local_368;
      local_2f0 = local_370;
      local_298 = local_328;
      local_2a0 = local_338;
      local_238 = local_328;
      local_240 = local_338;
      this_00 = pLVar6;
      local_2a8 = pLVar6;
      local_290 = pLVar6;
      std::ostream::operator<<((ostream *)(local_328 + 0x10),*local_338);
      local_250 = local_2b0;
      local_258 = local_2c0;
      local_260 = local_2c8;
      local_268 = local_2d0;
      local_270 = local_2d8;
      local_278 = local_2e0;
      local_280 = local_2e8;
      local_288 = local_2f0;
      local_228 = local_2b0;
      local_230 = local_2c0;
      local_1a8 = local_2b0;
      local_1b0 = local_2c0;
      buffer_00 = pLVar6;
      local_248 = pLVar6;
      local_220 = pLVar6;
      std::operator<<((ostream *)(local_2b0 + 0x10),local_2c0);
      local_1e8 = local_250;
      local_1f0 = local_260;
      local_1f8 = local_268;
      local_200 = local_270;
      local_208 = local_278;
      local_210 = local_280;
      local_218 = local_288;
      local_1d0 = local_250;
      local_1d8 = local_260;
      local_1b8 = local_250;
      local_1c0 = local_260;
      local_1e0 = pLVar6;
      local_1c8 = pLVar6;
      std::ostream::operator<<((ostream *)(local_250 + 0x10),*local_260);
      local_178 = local_1e8;
      local_180 = local_1f8;
      local_188 = local_200;
      local_190 = local_208;
      local_198 = local_210;
      local_1a0 = local_218;
      local_160 = local_1e8;
      local_168 = local_1f8;
      local_148 = local_1e8;
      local_150 = local_1f8;
      local_170 = pLVar6;
      local_158 = pLVar6;
      std::operator<<((ostream *)(local_1e8 + 0x10),local_1f8);
      local_120 = local_178;
      local_128 = local_188;
      local_130 = local_190;
      local_138 = local_198;
      local_140 = local_1a0;
      local_108 = local_178;
      local_110 = local_188;
      local_f0 = local_178;
      local_f8 = local_188;
      local_118 = pLVar6;
      local_100 = pLVar6;
      std::ostream::operator<<((ostream *)(local_178 + 0x10),*local_188);
      local_d0 = local_120;
      local_d8 = local_130;
      local_e0 = local_138;
      local_e8 = local_140;
      local_b8 = local_120;
      local_c0 = local_130;
      local_80 = local_120;
      local_88 = local_130;
      local_c8 = pLVar6;
      local_b0 = pLVar6;
      std::operator<<((ostream *)(local_120 + 0x10),local_130);
      local_98 = local_d0;
      local_a0 = local_e0;
      local_a8 = local_e8;
      local_70 = local_d0;
      local_78 = local_e0;
      local_40 = local_d0;
      local_48 = local_e0;
      local_90 = pLVar6;
      local_68 = pLVar6;
      std::ostream::operator<<((ostream *)(local_d0 + 0x10),*local_e0);
      local_58 = local_98;
      local_60 = local_a8;
      local_30 = local_98;
      local_38 = local_a8;
      local_50 = pLVar6;
      std::operator<<((ostream *)(local_98 + 0x10),local_a8);
      logger::OutputWorker::GetInstance();
      logger::OutputWorker::Write((OutputWorker *)this_00,buffer_00);
      logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x111d2f);
    }
  }
  return;
}

Assistant:

void FunctionTimer::Print(unsigned trials)
{
    if (trials == 1)
    {
        Logger.Info(FunctionName, " called ", Invokations, " times.  ", TotalUsec / (double)Invokations, " usec avg for all invokations.  ", TotalUsec, " usec");
    }
    else
    {
        Logger.Info(FunctionName, " called ", Invokations / (float)trials, " times per trial (avg).  ", TotalUsec / (double)Invokations, " usec avg for all invokations.  ", TotalUsec / (float)trials, " usec (avg) of ", trials, " trials");
    }
}